

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_srgb(spng_ctx *ctx,uint8_t rendering_intent)

{
  int iVar1;
  
  iVar1 = 1;
  if (((ctx != (spng_ctx *)0x0) &&
      (((ctx->data != (uchar *)0x0 || (iVar1 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
       (iVar1 = read_chunks(ctx,0), iVar1 == 0)))) && (iVar1 = 1, rendering_intent < 4)) {
    ctx->srgb_rendering_intent = rendering_intent;
    *(byte *)&ctx->stored = *(byte *)&ctx->stored | 0x40;
    *(byte *)&ctx->user = *(byte *)&ctx->user | 0x40;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int spng_set_srgb(spng_ctx *ctx, uint8_t rendering_intent)
{
    SPNG_SET_CHUNK_BOILERPLATE(ctx);

    if(rendering_intent > 3) return 1;

    ctx->srgb_rendering_intent = rendering_intent;

    ctx->stored.srgb = 1;
    ctx->user.srgb = 1;

    return 0;
}